

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

object * __thiscall
test_parser::deserialize_bytes
          (object *__return_storage_ptr__,test_parser *this,bytes_view_type in_data,
          text_encoding in_write_encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar1;
  size_t in_string_bytes;
  undefined8 uVar2;
  jessilib *this_00;
  string_view in_mbstring;
  u8string u8_string;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_58;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_48;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *local_28;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *local_20;
  
  in_mbstring._M_str = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)in_data._M_str;
  this_00 = (jessilib *)in_data._M_len;
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  switch(in_write_encoding) {
  case utf_8:
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    _M_replace(&local_48,0,0,(char8_t *)in_mbstring._M_str,(size_type)this_00);
    goto switchD_001e4dcf_caseD_2;
  case utf_16:
    local_20 = in_mbstring._M_str;
    local_28 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)((ulong)this_00 >> 1);
    if (((undefined1  [16])in_data & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x0;
      local_28 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x0;
    }
    jessilib::string_cast<char8_t,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               local_70,(jessilib *)&local_28,
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)local_28);
    break;
  default:
    goto switchD_001e4dcf_caseD_2;
  case utf_32:
    local_20 = in_mbstring._M_str;
    local_28 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)((ulong)this_00 >> 2);
    if (((undefined1  [16])in_data & (undefined1  [16])0x3) != (undefined1  [16])0x0) {
      local_20 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x0;
      local_28 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x0;
    }
    jessilib::string_cast<char8_t,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               local_70,(jessilib *)&local_28,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_28);
    break;
  case wchar:
    local_20 = in_mbstring._M_str;
    local_28 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)((ulong)this_00 >> 2);
    if (((undefined1  [16])in_data & (undefined1  [16])0x3) != (undefined1  [16])0x0) {
      local_20 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x0;
      local_28 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x0;
    }
    jessilib::string_cast<char8_t,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               local_70,(jessilib *)&local_28,local_28);
    break;
  case multibyte:
    in_mbstring._M_len = (size_t)in_mbstring._M_str;
    jessilib::mbstring_to_ustring<char8_t>
              ((pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                *)local_70,this_00,in_mbstring);
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=(&local_48,
              (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              (local_70 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_70._8_8_ == &local_58) goto switchD_001e4dcf_caseD_2;
    goto LAB_001e4f20;
  }
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator=(&local_48,
            (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_70);
  local_58._M_allocated_capacity = local_70._16_8_;
  local_70._8_8_ = local_70._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_70._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)(local_70 + 0x10)) {
LAB_001e4f20:
    operator_delete((void *)local_70._8_8_,local_58._M_allocated_capacity + 1);
  }
switchD_001e4dcf_caseD_2:
  local_70._0_8_ = local_48._M_string_length;
  local_70._8_8_ = local_48._M_dataplus._M_p;
  if (deserialize_impl.super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar2 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    _Unwind_Resume(uVar2);
  }
  (*deserialize_impl._M_invoker)
            (__return_storage_ptr__,(_Any_data *)&deserialize_impl,
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

object deserialize_bytes(bytes_view_type in_data, text_encoding in_write_encoding) override {
		std::u8string u8_string;

		switch (in_write_encoding) {
			case text_encoding::utf_8:
				u8_string = string_view_cast<char8_t>(in_data);
				break;
			case text_encoding::utf_16:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<char16_t>(in_data));
				break;
			case text_encoding::utf_32:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<char32_t>(in_data));
				break;
			case text_encoding::wchar:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<wchar_t>(in_data));
				break;
			case text_encoding::multibyte:
				u8_string = mbstring_to_ustring<char8_t>(string_view_cast<char>(in_data)).second;
				break;
			default:
				break;
		}

		return deserialize_impl(std::u8string_view{ u8_string });
	}